

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParseEncoding(State *state)

{
  bool bVar1;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    bVar1 = ParseName(guard.state_);
    if (bVar1) {
      bVar1 = ParseBareFunctionType(guard.state_);
      if (bVar1) {
        ParseQRequiresClauseExpr(guard.state_);
        state_local._7_1_ = true;
      }
      else {
        state_local._7_1_ = true;
      }
    }
    else {
      bVar1 = ParseSpecialName(guard.state_);
      if (bVar1) {
        state_local._7_1_ = true;
      }
      else {
        state_local._7_1_ = false;
      }
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseEncoding(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  // Since the first two productions both start with <name>, attempt
  // to parse it only once to avoid exponential blowup of backtracking.
  //
  // We're careful about exponential blowup because <encoding> recursively
  // appears in other productions downstream of its first two productions,
  // which means that every call to `ParseName` would possibly indirectly
  // result in two calls to `ParseName` etc.
  if (ParseName(state)) {
    if (!ParseBareFunctionType(state)) {
      return true;  // <(data) name>
    }

    // Parsed: <(function) name> <bare-function-type>
    // Pending: [`Q` <requires-clause expr>]
    ParseQRequiresClauseExpr(state);  // restores state on failure
    return true;
  }

  if (ParseSpecialName(state)) {
    return true;  // <special-name>
  }
  return false;
}